

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O3

DdNode * cuddLocalCacheLookup(DdLocalCache *cache,DdNodePtr *key)

{
  unsigned_long *puVar1;
  uint uVar2;
  uint uVar3;
  DdLocalCacheItem *__ptr;
  DdNode *pDVar4;
  long lVar5;
  uint uVar6;
  _func_void_long *p_Var7;
  int iVar8;
  ulong uVar9;
  DdLocalCacheItem *__s;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  undefined8 *puVar17;
  ulong uVar18;
  double dVar19;
  
  dVar19 = cache->lookUps + 1.0;
  cache->lookUps = dVar19;
  uVar2 = cache->keysize;
  uVar15 = (ulong)uVar2;
  iVar11 = cache->shift;
  uVar16 = *(int *)key * 0x40f1f9;
  if (1 < uVar15) {
    uVar9 = 1;
    do {
      uVar16 = uVar16 * 0xc00005 + *(int *)(key + uVar9);
      uVar9 = uVar9 + 1;
    } while (uVar15 != uVar9);
  }
  __ptr = cache->item;
  uVar3 = cache->itemsize;
  uVar9 = (ulong)((uVar16 >> ((byte)iVar11 & 0x1f)) * uVar3);
  pDVar4 = *(DdNode **)((long)__ptr->key + (uVar9 - 8));
  if (pDVar4 != (DdNode *)0x0) {
    puVar17 = (undefined8 *)((long)__ptr->key + (uVar9 - 8));
    iVar8 = bcmp(key,puVar17 + 1,uVar15 * 8);
    if (iVar8 == 0) {
      cache->hits = cache->hits + 1.0;
      if (((DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe))->ref != 0) {
        return pDVar4;
      }
      cuddReclaim(cache->manager,(DdNode *)((ulong)pDVar4 & 0xfffffffffffffffe));
      return (DdNode *)*puVar17;
    }
  }
  uVar16 = cache->slots;
  if ((uVar16 < cache->maxslots) && (dVar19 * cache->minHit < cache->hits)) {
    uVar6 = uVar16 * 2;
    cache->slots = uVar6;
    p_Var7 = Extra_UtilMMoutOfMemory;
    __s = (DdLocalCacheItem *)malloc((ulong)(uVar6 * uVar3));
    cache->item = __s;
    Extra_UtilMMoutOfMemory = p_Var7;
    if (__s == (DdLocalCacheItem *)0x0) {
      cache->slots = uVar16;
      cache->item = __ptr;
      cache->maxslots = uVar16 - 1;
    }
    else {
      iVar11 = iVar11 + -1;
      cache->shift = iVar11;
      puVar1 = &cache->manager->memused;
      *puVar1 = *puVar1 + (ulong)(uVar16 * uVar3);
      uVar9 = 0;
      memset(__s,0,(ulong)(uVar6 * uVar3));
      if (uVar16 != 0) {
        uVar18 = 0;
        do {
          uVar12 = (ulong)(uVar3 * (int)uVar18);
          lVar5 = *(long *)((long)__ptr->key + (uVar12 - 8));
          if (lVar5 != 0) {
            uVar13 = *(int *)((long)__ptr->key + uVar12) * 0x40f1f9;
            if (1 < uVar2) {
              lVar10 = 0;
              do {
                uVar13 = uVar13 * 0xc00005 + *(int *)((long)__ptr[1].key + lVar10 * 8 + uVar9 + -8);
                lVar10 = lVar10 + 1;
              } while (uVar15 - 1 != lVar10);
            }
            uVar14 = (ulong)((uVar13 >> ((byte)iVar11 & 0x1f)) * uVar3);
            memcpy((void *)((long)__s->key + uVar14),(void *)((long)__ptr->key + uVar12),uVar15 * 8)
            ;
            *(long *)((long)__s->key + (uVar14 - 8)) = lVar5;
          }
          uVar18 = uVar18 + 1;
          uVar9 = (ulong)((int)uVar9 + uVar3);
        } while (uVar18 != uVar16);
      }
      free(__ptr);
      cache->lookUps = (double)(int)((double)uVar6 * cache->minHit + 1.0);
      cache->hits = 0.0;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddLocalCacheLookup(
  DdLocalCache * cache,
  DdNodePtr * key)
{
    unsigned int posn;
    DdLocalCacheItem *entry;
    DdNode *value;

    cache->lookUps++;
    posn = ddLCHash(key,cache->keysize,cache->shift);
    entry = (DdLocalCacheItem *) ((char *) cache->item +
                                  posn * cache->itemsize);
    if (entry->value != NULL &&
        memcmp(key,entry->key,cache->keysize*sizeof(DdNode *)) == 0) {
        cache->hits++;
        value = Cudd_Regular(entry->value);
        if (value->ref == 0) {
            cuddReclaim(cache->manager,value);
        }
        return(entry->value);
    }

    /* Cache miss: decide whether to resize */

    if (cache->slots < cache->maxslots &&
        cache->hits > cache->lookUps * cache->minHit) {
        cuddLocalCacheResize(cache);
    }

    return(NULL);

}